

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O1

bool __thiscall edk2_vss_t::vss_variable_t::is_intel_legacy(vss_variable_t *this)

{
  bool bVar1;
  
  if (this->f_is_intel_legacy == true) {
    return this->m_is_intel_legacy;
  }
  bVar1 = (this->m_state & 0xfb) == 0xf8;
  this->m_is_intel_legacy = bVar1;
  this->f_is_intel_legacy = true;
  return bVar1;
}

Assistant:

bool edk2_vss_t::vss_variable_t::is_intel_legacy() {
    if (f_is_intel_legacy)
        return m_is_intel_legacy;
    m_is_intel_legacy =  ((state() == 248) || (state() == 252)) ;
    f_is_intel_legacy = true;
    return m_is_intel_legacy;
}